

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaSN.cpp
# Opt level: O0

void __thiscall OmegaSN::~OmegaSN(OmegaSN *this)

{
  uint local_1c;
  uint local_18;
  uint j;
  uint i_1;
  uint i;
  OmegaSN *this_local;
  
  if (this->states != (double *)0x0) {
    operator_delete(this->states);
  }
  this->states = (double *)0x0;
  for (j = 0; j < 3; j = j + 1) {
    if (this->S12P[j] != (double *)0x0) {
      operator_delete(this->S12P[j]);
    }
  }
  if (this->S12P != (double **)0x0) {
    operator_delete__(this->S12P);
  }
  this->S12P = (double **)0x0;
  for (local_18 = 0; local_18 < this->nbSegments; local_18 = local_18 + 1) {
    for (local_1c = 0; local_1c < this->nbStates; local_1c = local_1c + 1) {
      if (this->Q[local_18][local_1c] != (double *)0x0) {
        operator_delete(this->Q[local_18][local_1c]);
      }
      if (this->lastChpt[local_18][local_1c] != (uint *)0x0) {
        operator_delete(this->lastChpt[local_18][local_1c]);
      }
      if (this->lastIndState[local_18][local_1c] != (uint *)0x0) {
        operator_delete(this->lastIndState[local_18][local_1c]);
      }
    }
    if (this->Q[local_18] != (double **)0x0) {
      operator_delete(this->Q[local_18]);
    }
    if (this->lastChpt[local_18] != (uint **)0x0) {
      operator_delete(this->lastChpt[local_18]);
    }
    if (this->lastIndState[local_18] != (uint **)0x0) {
      operator_delete(this->lastIndState[local_18]);
    }
  }
  if (this->Q != (double ***)0x0) {
    operator_delete__(this->Q);
  }
  if (this->lastChpt != (uint ***)0x0) {
    operator_delete__(this->lastChpt);
  }
  if (this->lastIndState != (uint ***)0x0) {
    operator_delete__(this->lastIndState);
  }
  this->Q = (double ***)0x0;
  this->lastChpt = (uint ***)0x0;
  this->lastIndState = (uint ***)0x0;
  std::vector<double,_std::allocator<double>_>::~vector(&this->parameters);
  std::vector<int,_std::allocator<int>_>::~vector(&this->changepoints);
  return;
}

Assistant:

OmegaSN::~OmegaSN()
{
  delete(states);
  states = NULL;
  for(unsigned int i = 0; i < 3; i++){delete(S12P[i]);}
  delete [] S12P;
  S12P = NULL;

  for(unsigned int i = 0; i < nbSegments; i++)
  {
    for(unsigned int j = 0; j < nbStates; j++)
    {
      delete(Q[i][j]);
      delete(lastChpt[i][j]);
      delete(lastIndState[i][j]);
      }
    delete(Q[i]);
    delete(lastChpt[i]);
    delete(lastIndState[i]);
  }
  delete [] Q;
  delete [] lastChpt;
  delete [] lastIndState;
  Q = NULL;
  lastChpt = NULL;
  lastIndState = NULL;
}